

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf::to_object(xr_ogf *this,xr_sg_type sg_type)

{
  xr_ogf *pxVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  xr_mesh_builder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar7;
  undefined4 extraout_var_01;
  reference ppxVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar9;
  string *psVar10;
  xr_ogf *ogf_1;
  xr_ogf_vec_it end_1;
  xr_ogf_vec_it it_1;
  uint16_t shader_id;
  xr_ogf *ogf;
  xr_ogf_vec_it end;
  xr_ogf_vec_it it;
  size_t sStack_40;
  uint vb_signature;
  size_t ib_reserve;
  size_t vb_reserve;
  xr_mesh_builder *mesh;
  xr_sg_type sg_type_local;
  xr_ogf *this_local;
  
  this_00 = (xr_mesh_builder *)operator_new(600);
  xr_mesh_builder::xr_mesh_builder(this_00,sg_type);
  uVar3 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])();
  if ((uVar3 & 1) == 0) {
    iVar4 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])();
    uVar5 = xr_vbuf::signature((xr_vbuf *)CONCAT44(extraout_var_04,iVar4));
    xr_mesh_builder::prepare(this_00,uVar5,0,0);
    iVar4 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])();
    iVar6 = (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])();
    xr_mesh_builder::push
              (this_00,(xr_vbuf *)CONCAT44(extraout_var_05,iVar4),
               (xr_ibuf *)CONCAT44(extraout_var_06,iVar6),0,0);
  }
  else {
    ib_reserve = 0;
    sStack_40 = 0;
    it._M_current._4_4_ = 0;
    end._M_current =
         (xr_ogf **)
         std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin
                   (&this->m_children);
    ogf = (xr_ogf *)
          std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end(&this->m_children)
    ;
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                    *)&ogf), bVar2) {
      ppxVar8 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                ::operator*(&end);
      pxVar1 = *ppxVar8;
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])()
      ;
      uVar5 = xr_vbuf::signature((xr_vbuf *)CONCAT44(extraout_var,iVar4));
      it._M_current._4_4_ = uVar5 | it._M_current._4_4_;
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])()
      ;
      sVar7 = xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_00,iVar4));
      ib_reserve = sVar7 + ib_reserve;
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])()
      ;
      sVar7 = xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_01,iVar4));
      sStack_40 = sVar7 + sStack_40;
      uVar3 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x19])()
      ;
      if ((uVar3 & 1) != 0) {
        (this->super_xr_object).m_flags = (this->super_xr_object).m_flags | 2;
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
      ::operator++(&end);
    }
    xr_mesh_builder::prepare(this_00,it._M_current._4_4_,ib_reserve,sStack_40);
    it_1._M_current._6_2_ = 0;
    end_1._M_current =
         (xr_ogf **)
         std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin
                   (&this->m_children);
    ogf_1 = (xr_ogf *)
            std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end
                      (&this->m_children);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end_1,(__normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                                      *)&ogf_1), bVar2) {
      ppxVar8 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
                ::operator*(&end_1);
      pxVar1 = *ppxVar8;
      iVar4 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])()
      ;
      iVar6 = (*(pxVar1->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])()
      ;
      xr_mesh_builder::push
                (this_00,(xr_vbuf *)CONCAT44(extraout_var_02,iVar4),
                 (xr_ibuf *)CONCAT44(extraout_var_03,iVar6),it_1._M_current._6_2_,
                 it_1._M_current._6_2_);
      it_1._M_current._6_2_ = it_1._M_current._6_2_ + 1;
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
      ::operator++(&end_1);
    }
  }
  xr_mesh_builder::compact_geometry(this_00);
  xr_mesh_builder::remove_duplicate_faces(this_00);
  xr_mesh_builder::remove_back_faces(this_00,1e-06);
  xr_mesh_builder::commit(this_00,&this->super_xr_object);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    psVar10 = xr_mesh::name_abi_cxx11_((xr_mesh *)this_00);
    xr_file_system::split_path(&this->m_path,(string *)0x0,psVar10,(string *)0x0);
    psVar10 = xr_mesh::name_abi_cxx11_((xr_mesh *)this_00);
    std::__cxx11::string::operator+=((string *)psVar10,"Shape");
  }
  else {
    psVar10 = xr_mesh::name_abi_cxx11_((xr_mesh *)this_00);
    std::__cxx11::string::operator=((string *)psVar10,"ogfShape");
  }
  (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[6])();
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  return;
}

Assistant:

void xr_ogf::to_object(xr_sg_type sg_type)
{
	xr_mesh_builder* mesh = new xr_mesh_builder(sg_type);
	if (hierarchical()) {
		size_t vb_reserve = 0, ib_reserve = 0;
		unsigned vb_signature = 0;
		for (xr_ogf_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it) {
			xr_ogf* ogf = *it;
			vb_signature |= ogf->vb().signature();
			vb_reserve += ogf->vb().size();
			ib_reserve += ogf->ib().size();
			if (ogf->progressive())
				m_flags |= EOF_PROGRESSIVE;
		}
		mesh->prepare(vb_signature, vb_reserve, ib_reserve);
		uint16_t shader_id = 0;
		for (xr_ogf_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it) {
			xr_ogf* ogf = *it;
			mesh->push(ogf->vb(), ogf->ib(), shader_id, shader_id);
			++shader_id;
		}
	} else {
		mesh->prepare(vb().signature());
		mesh->push(vb(), ib(), 0, 0);
	}
	mesh->compact_geometry();
	mesh->remove_duplicate_faces();
	mesh->remove_back_faces();
	mesh->commit(*this);
	if (m_path.empty()) {
		mesh->name() = "ogfShape";
	} else {
		xr_file_system::split_path(m_path, 0, &mesh->name());
		mesh->name() += "Shape";
	}
	denominate_surfaces();
	trim_container(m_children);
	trim_container(m_lods);
}